

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

void __thiscall r_exec::CTPX::store_input(CTPX *this,View *input)

{
  atomic_int_fast64_t *paVar1;
  Code *object;
  BindingMap *this_00;
  Code *abstraction;
  P<r_exec::BindingMap> bm;
  Input i;
  
  object = (Code *)(input->super_View).object.object;
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  bm.object = (_Object *)this_00;
  abstraction = BindingMap::abstract_object(this_00,object,false);
  Input::Input(&i,input,(_Fact *)abstraction,this_00);
  r_code::list<r_exec::Input>::push_front(&(this->super__TPX).inputs,&i);
  if (object == (Code *)(this->super__TPX).super_TPX.target.object) {
    this->stored_premise = true;
  }
  Input::~Input(&i);
  core::P<r_exec::BindingMap>::~P(&bm);
  return;
}

Assistant:

void CTPX::store_input(r_exec::View *input)
{
    _Fact *input_object = (_Fact *)input->object;
    P<BindingMap> bm = new BindingMap();
    _Fact *abstracted_input = (_Fact *)bm->abstract_object(input_object, false);
    Input i(input, abstracted_input, bm);
    inputs.push_front(i);

    if (input_object == target) {
        stored_premise = true;
    }
}